

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngrutil.c
# Opt level: O2

void png_handle_sBIT(png_structrp png_ptr,png_inforp info_ptr,png_uint_32 length)

{
  png_byte *ppVar1;
  png_byte pVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  png_byte *ppVar6;
  char *error_message;
  ulong uVar7;
  byte bVar8;
  png_byte local_24 [4];
  
  if ((png_ptr->mode & 1) == 0) {
    png_chunk_error(png_ptr,"missing IHDR");
  }
  if ((png_ptr->mode & 6) == 0) {
    if ((info_ptr == (png_inforp)0x0) || ((info_ptr->valid & 2) == 0)) {
      if (png_ptr->color_type == '\x03') {
        bVar8 = 8;
        uVar3 = 3;
      }
      else {
        uVar3 = (uint)png_ptr->channels;
        bVar8 = png_ptr->bit_depth;
      }
      if ((length < 5) && (uVar3 == length)) {
        iVar4 = (uint)bVar8 * 0x1010101;
        png_crc_read(png_ptr,local_24,length);
        iVar5 = png_crc_finish(png_ptr,0);
        if (iVar5 == 0) {
          ppVar6 = local_24 + 3;
          uVar7 = 0;
          do {
            if (length == uVar7) {
              local_24[0] = (png_byte)iVar4;
              if ((png_ptr->color_type & 2) == 0) {
                (png_ptr->sig_bit).gray = local_24[0];
                ppVar6 = local_24 + 1;
                local_24[2] = local_24[0];
                local_24[1] = local_24[0];
              }
              else {
                local_24[1] = (png_byte)((uint)iVar4 >> 8);
                local_24[2] = (png_byte)((uint)iVar4 >> 0x10);
              }
              pVar2 = *ppVar6;
              (png_ptr->sig_bit).red = local_24[0];
              (png_ptr->sig_bit).green = local_24[1];
              (png_ptr->sig_bit).blue = local_24[2];
              (png_ptr->sig_bit).alpha = pVar2;
              png_set_sBIT(png_ptr,info_ptr,&png_ptr->sig_bit);
              return;
            }
            ppVar1 = local_24 + uVar7;
            uVar7 = uVar7 + 1;
          } while ((byte)(*ppVar1 - 1) < bVar8);
          png_chunk_benign_error(png_ptr,"invalid");
        }
        return;
      }
      png_chunk_benign_error(png_ptr,"invalid");
      png_crc_finish(png_ptr,length);
      return;
    }
    png_crc_finish(png_ptr,length);
    error_message = "duplicate";
  }
  else {
    png_crc_finish(png_ptr,length);
    error_message = "out of place";
  }
  png_chunk_benign_error(png_ptr,error_message);
  return;
}

Assistant:

void /* PRIVATE */
png_handle_sBIT(png_structrp png_ptr, png_inforp info_ptr, png_uint_32 length)
{
   unsigned int truelen, i;
   png_byte sample_depth;
   png_byte buf[4];

   png_debug(1, "in png_handle_sBIT");

   if ((png_ptr->mode & PNG_HAVE_IHDR) == 0)
      png_chunk_error(png_ptr, "missing IHDR");

   else if ((png_ptr->mode & (PNG_HAVE_IDAT|PNG_HAVE_PLTE)) != 0)
   {
      png_crc_finish(png_ptr, length);
      png_chunk_benign_error(png_ptr, "out of place");
      return;
   }

   if (info_ptr != NULL && (info_ptr->valid & PNG_INFO_sBIT) != 0)
   {
      png_crc_finish(png_ptr, length);
      png_chunk_benign_error(png_ptr, "duplicate");
      return;
   }

   if (png_ptr->color_type == PNG_COLOR_TYPE_PALETTE)
   {
      truelen = 3;
      sample_depth = 8;
   }

   else
   {
      truelen = png_ptr->channels;
      sample_depth = png_ptr->bit_depth;
   }

   if (length != truelen || length > 4)
   {
      png_chunk_benign_error(png_ptr, "invalid");
      png_crc_finish(png_ptr, length);
      return;
   }

   buf[0] = buf[1] = buf[2] = buf[3] = sample_depth;
   png_crc_read(png_ptr, buf, truelen);

   if (png_crc_finish(png_ptr, 0) != 0)
      return;

   for (i=0; i<truelen; ++i)
   {
      if (buf[i] == 0 || buf[i] > sample_depth)
      {
         png_chunk_benign_error(png_ptr, "invalid");
         return;
      }
   }

   if ((png_ptr->color_type & PNG_COLOR_MASK_COLOR) != 0)
   {
      png_ptr->sig_bit.red = buf[0];
      png_ptr->sig_bit.green = buf[1];
      png_ptr->sig_bit.blue = buf[2];
      png_ptr->sig_bit.alpha = buf[3];
   }

   else
   {
      png_ptr->sig_bit.gray = buf[0];
      png_ptr->sig_bit.red = buf[0];
      png_ptr->sig_bit.green = buf[0];
      png_ptr->sig_bit.blue = buf[0];
      png_ptr->sig_bit.alpha = buf[1];
   }

   png_set_sBIT(png_ptr, info_ptr, &(png_ptr->sig_bit));
}